

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

void anon_unknown.dwarf_f2215::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<Imath_3_2::half_*> *halfData,int width,int height)

{
  half **pphVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < height) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (0 < width) {
        uVar4 = 0;
        do {
          if (type == 2) {
            pphVar1 = (half **)(halfData->_sizeY * lVar3 + (long)halfData->_data);
LAB_0014e22f:
            if (pphVar1[uVar4] != (half *)0x0) {
              operator_delete__(pphVar1[uVar4]);
            }
          }
          else {
            if (type == 1) {
              pphVar1 = (half **)(floatData->_sizeY * lVar3 + (long)floatData->_data);
              goto LAB_0014e22f;
            }
            if (type == 0) {
              pphVar1 = (half **)(uintData->_sizeY * lVar3 + (long)uintData->_data);
              goto LAB_0014e22f;
            }
          }
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar2 != (uint)height);
  }
  return;
}

Assistant:

void
releasePixels (
    int                     type,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     width,
    int                     height)
{
    releasePixels (
        type, uintData, floatData, halfData, 0, width - 1, 0, height - 1);
}